

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O0

void __thiscall VcdGen::VcdGenerator::generate_module_info(VcdGenerator *this,Module *module)

{
  bool bVar1;
  uint32_t __val;
  vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_> *this_00;
  reference ppSVar2;
  vector<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_> *this_01;
  reference ppMVar3;
  Module *m;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_> *__range2_1;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Signal *local_a8;
  Signal *signal;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_> *__range2;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Module *local_18;
  Module *module_local;
  VcdGenerator *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  Module::get_name_abi_cxx11_(&local_78,module);
  std::operator+(&local_58,"$scope module ",&local_78);
  std::operator+(&local_38,&local_58," $end\n");
  std::__cxx11::string::operator+=((string *)&this->vcd_data_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = Module::get_signals(local_18);
  __end2 = std::vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>::begin(this_00);
  signal = (Signal *)std::vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<VcdGen::Signal_*const_*,_std::vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>_>
                                *)&signal);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<VcdGen::Signal_*const_*,_std::vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>_>
              ::operator*(&__end2);
    local_a8 = *ppSVar2;
    __val = Signal::get_width(local_a8);
    std::__cxx11::to_string(&local_188,__val);
    std::operator+(&local_168,"$var wire ",&local_188);
    std::operator+(&local_148,&local_168," ");
    Signal::get_encoded_name_abi_cxx11_(&local_1a8,local_a8);
    std::operator+(&local_128,&local_148,&local_1a8);
    std::operator+(&local_108,&local_128," ");
    Signal::get_name_abi_cxx11_((string *)&__range2_1,local_a8);
    std::operator+(&local_e8,&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2_1)
    ;
    std::operator+(&local_c8,&local_e8," $end\n");
    std::__cxx11::string::operator+=((string *)&this->vcd_data_,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&__range2_1);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    __gnu_cxx::
    __normal_iterator<VcdGen::Signal_*const_*,_std::vector<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>_>
    ::operator++(&__end2);
  }
  this_01 = Module::get_submodules(local_18);
  __end2_1 = std::vector<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>::begin(this_01);
  m = (Module *)std::vector<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<VcdGen::Module_*const_*,_std::vector<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>_>
                        *)&m);
    if (!bVar1) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<VcdGen::Module_*const_*,_std::vector<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>_>
              ::operator*(&__end2_1);
    generate_module_info(this,*ppMVar3);
    __gnu_cxx::
    __normal_iterator<VcdGen::Module_*const_*,_std::vector<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>_>
    ::operator++(&__end2_1);
  }
  std::__cxx11::string::operator+=((string *)&this->vcd_data_,"$upscope $end\n");
  return;
}

Assistant:

void generate_module_info(Module* module){
        vcd_data_ += "$scope module " + module->get_name() + " $end\n";
        for( auto signal : module->get_signals() ){
            vcd_data_ += "$var wire " + to_string(signal->get_width()) + " " + 
                         signal->get_encoded_name() + " " + signal->get_name() + 
                         " $end\n";
        }

        //if( module->get_num_submodules() > 0){
        //    vector<Module*> &sub_mods = module->get_submodules();
        //    Module* m = sub_mods[0];
        //    sub_mods.erase(sub_mods.begin());
        //    generate_module_info(m);
        //}

        for( auto m : module->get_submodules() ){
            generate_module_info(m);
        } 
        
        vcd_data_ += "$upscope $end\n";
    }